

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSocketServerTests::TestsocketServerFixtureblock::RunImpl(TestsocketServerFixtureblock *this)

{
  socketServerFixtureblockHelper fixtureHelper;
  
  fixtureHelper.super_socketServerFixture.bufLen = 0;
  fixtureHelper.m_details = &(this->super_Test).m_details;
  fixtureHelper.super_socketServerFixture.connect = 0;
  fixtureHelper.super_socketServerFixture.write = 0;
  fixtureHelper.super_socketServerFixture.data = 0;
  fixtureHelper.super_socketServerFixture.disconnect = 0;
  fixtureHelper.super_socketServerFixture.connectSocket = 0;
  fixtureHelper.super_socketServerFixture.writeSocket = 0;
  fixtureHelper.super_socketServerFixture.dataSocket = 0;
  fixtureHelper.super_socketServerFixture.disconnectSocket = 0;
  fixtureHelper.super_socketServerFixture.super_Strategy._vptr_Strategy =
       (_func_int **)&PTR__Strategy_0032aa58;
  UnitTest::ExecuteTest<SuiteSocketServerTests::socketServerFixtureblockHelper>
            (&fixtureHelper,fixtureHelper.m_details);
  return;
}

Assistant:

TEST_FIXTURE(socketServerFixture, block)
{
  SocketServer object( 0 );
  object.add( TestSettings::port, true, true );
  socket_handle clientS = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS >= 0 );

  object.block( *this );
  CHECK_EQUAL( 1, connect );
  CHECK( connectSocket > 0 );

  send( clientS, "1", 1, 0 );
  object.block( *this );
  object.block( *this );
  CHECK_EQUAL( 1, data );
  CHECK_EQUAL( 1U, bufLen );
  CHECK_EQUAL( '1', *buf );
  CHECK( dataSocket > 0 );

  destroySocket( clientS );
  object.block( *this );
  CHECK_EQUAL( 1, disconnect );
  CHECK( disconnectSocket > 0 );
}